

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O0

Slice __thiscall arangodb::velocypack::ObjectIterator::key(ObjectIterator *this,bool translate)

{
  byte translate_00;
  bool bVar1;
  Exception *this_00;
  byte in_SIL;
  ObjectIterator *in_RDI;
  Slice s;
  ExceptionType in_stack_ffffffffffffffcc;
  Slice local_20;
  ObjectIterator *index;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_fffffffffffffff8;
  
  translate_00 = in_SIL & 1;
  index = in_RDI;
  bVar1 = valid(in_RDI);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(this_00,in_stack_ffffffffffffffcc);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  if (in_RDI->_current == (uint8_t *)0x0) {
    local_20 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getNthKey
                         (in_stack_fffffffffffffff8,(ValueLength)index,(bool)translate_00);
  }
  else {
    Slice::Slice(&local_20,in_RDI->_current);
    if ((translate_00 & 1) != 0) {
      local_20 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::makeKey
                           ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                            in_RDI);
    }
  }
  return (Slice)local_20._start;
}

Assistant:

[[nodiscard]] Slice key(bool translate = true) const {
    if (VELOCYPACK_UNLIKELY(!valid())) {
      throw Exception{Exception::IndexOutOfBounds};
    }
    if (_current != nullptr) {
      Slice s{_current};
      return translate ? s.makeKey() : s;
    }
    return _slice.getNthKey(_position, translate);
  }